

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O2

int32_t __thiscall aeron::Counter::state(Counter *this)

{
  int32_t iVar1;
  
  iVar1 = concurrent::CountersReader::getCounterState
                    (&this->m_clientConductor->m_countersReader,
                     (this->super_AtomicCounter).m_counterId);
  return iVar1;
}

Assistant:

std::int32_t Counter::state() const
{
    return m_clientConductor->countersReader().getCounterState(id());
}